

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncryptionOperator.cpp
# Opt level: O0

void __thiscall adios2::plugin::EncryptionOperator::EncryptImpl::~EncryptImpl(EncryptImpl *this)

{
  string *in_RDI;
  
  sodium_munlock(in_RDI + 0x20,0x20);
  std::__cxx11::string::~string(in_RDI);
  return;
}

Assistant:

~EncryptImpl()
    {
        // unlocks the memory location as well as zeroing out the data
        sodium_munlock(Key, crypto_secretbox_KEYBYTES);
    }